

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner_product_impl.h
# Opt level: O2

size_t secp256k1_bulletproof_innerproduct_proof_length(size_t n)

{
  size_t sVar1;
  size_t sVar2;
  
  if (n < 2) {
    sVar2 = n << 6 | 0x20;
  }
  else {
    sVar2 = secp256k1_popcountl(n);
    sVar1 = secp256k1_floor_lg(n >> 1 & 0x3fffffffffffffff);
    sVar2 = (sVar2 + sVar1) * 0x40 + (sVar1 * 2 + 7 >> 3) + 0x60;
  }
  return sVar2;
}

Assistant:

size_t secp256k1_bulletproof_innerproduct_proof_length(size_t n) {
    if (n < IP_AB_SCALARS / 2) {
        return 32 * (1 + 2 * n);
    } else {
        size_t bit_count = secp256k1_popcountl(n);
        size_t log = secp256k1_floor_lg(2 * n / IP_AB_SCALARS);
        return 32 * (1 + 2 * (bit_count - 1 + log) + IP_AB_SCALARS) + (2*log + 7) / 8;
    }
}